

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_small_width_height_test.cc
# Opt level: O0

void anon_unknown.dwarf_a24457::EncodeSmallWidthMultiThreadedSpeed0
               (aom_img_fmt fmt,aom_codec_flags_t flag)

{
  bool bVar1;
  AssertHelper *this;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  aom_codec_ctx_t enc;
  AssertionResult gtest_ar_1;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  AssertionResult gtest_ar;
  aom_image_t img;
  int kHeight;
  int kWidth;
  aom_codec_ctx_t *in_stack_fffffffffffffa08;
  AssertHelper *in_stack_fffffffffffffa10;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffa18;
  aom_codec_iface_t *in_stack_fffffffffffffa20;
  uchar *in_stack_fffffffffffffa28;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffa30;
  aom_image_t *in_stack_fffffffffffffa38;
  Type type;
  aom_image_t *in_stack_fffffffffffffa40;
  AssertionResult local_5a0 [2];
  aom_codec_err_t local_580;
  undefined4 local_57c;
  Message *in_stack_fffffffffffffa88;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffa90;
  AssertionResult local_550 [2];
  aom_codec_err_t local_530;
  AssertionResult local_500;
  aom_codec_ctx_t local_4f0;
  aom_codec_err_t local_4a8;
  undefined4 local_4a4;
  AssertionResult local_4a0;
  undefined4 local_48c;
  undefined4 local_484;
  undefined4 local_480;
  aom_codec_iface_t *local_108;
  aom_image_t *local_e0;
  undefined1 *local_d8;
  AssertionResult local_d0;
  undefined1 local_c0 [168];
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 0x100;
  local_18 = 0x200;
  local_d8 = local_c0;
  local_e0 = aom_img_wrap(in_stack_fffffffffffffa40,
                          (aom_img_fmt_t)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                          (uint)in_stack_fffffffffffffa38,
                          (uint)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                          (uint)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             (aom_image **)in_stack_fffffffffffffa18,(aom_image **)in_stack_fffffffffffffa10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa40 =
         (aom_image_t *)testing::AssertionResult::failure_message((AssertionResult *)0x80f67e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),(char *)in_stack_fffffffffffffa30,
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa10);
    testing::Message::~Message((Message *)0x80f6db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80f74c);
  local_108 = aom_codec_av1_cx();
  local_4a4 = 0;
  local_4a8 = aom_codec_enc_config_default
                        (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                         (uint)((ulong)in_stack_fffffffffffffa10 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             &in_stack_fffffffffffffa18->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa38 =
         (aom_image_t *)testing::AssertionResult::failure_message((AssertionResult *)0x80f7f3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),(char *)in_stack_fffffffffffffa30,
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa10);
    testing::Message::~Message((Message *)0x80f850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80f8c1);
  local_48c = 2;
  local_484 = 0x100;
  local_480 = 0x200;
  aom_codec_enc_init_ver
            ((aom_codec_ctx_t *)in_stack_fffffffffffffa40,
             (aom_codec_iface_t *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
             (aom_codec_flags_t)in_stack_fffffffffffffa28,
             (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             &in_stack_fffffffffffffa18->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_500);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa30 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x80f990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),(char *)in_stack_fffffffffffffa30,
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa10);
    testing::Message::~Message((Message *)0x80f9ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80fa5b);
  local_530 = aom_codec_control(&local_4f0,0xd,0);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             &in_stack_fffffffffffffa18->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffad8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa28 =
         (uchar *)testing::AssertionResult::failure_message((AssertionResult *)0x80faf4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),(char *)in_stack_fffffffffffffa30,
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa10);
    testing::Message::~Message((Message *)0x80fb51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80fbc2);
  aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                   (aom_codec_pts_t)in_stack_fffffffffffffa30,
                   (unsigned_long)in_stack_fffffffffffffa28,
                   (aom_enc_frame_flags_t)in_stack_fffffffffffffa20);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             &in_stack_fffffffffffffa18->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa20 =
         (aom_codec_iface_t *)testing::AssertionResult::failure_message((AssertionResult *)0x80fc67)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),(char *)in_stack_fffffffffffffa30,
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa10);
    testing::Message::~Message((Message *)0x80fcc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80fd32);
  local_57c = 0;
  local_580 = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffffa40,
                               in_stack_fffffffffffffa38,(aom_codec_pts_t)in_stack_fffffffffffffa30,
                               (unsigned_long)in_stack_fffffffffffffa28,
                               (aom_enc_frame_flags_t)in_stack_fffffffffffffa20);
  type = (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             &in_stack_fffffffffffffa18->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffa88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa18 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x80fdc1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,type,(char *)in_stack_fffffffffffffa30,
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffa10);
    testing::Message::~Message((Message *)0x80fe0f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80fe77);
  aom_codec_destroy(in_stack_fffffffffffffa08);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             &in_stack_fffffffffffffa18->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffa10);
  line = (int)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa40);
    this = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x80feef);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffa40,type,(char *)in_stack_fffffffffffffa30,line
               ,(char *)in_stack_fffffffffffffa20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffa90._M_head_impl,in_stack_fffffffffffffa88);
    testing::internal::AssertHelper::~AssertHelper(this);
    testing::Message::~Message((Message *)0x80ff3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80ff9f);
  return;
}

Assistant:

void EncodeSmallWidthMultiThreadedSpeed0(aom_img_fmt fmt,
                                         aom_codec_flags_t flag) {
  // The image has only one tile and the tile is two AV1 superblocks wide.
  // For speed 0, superblock size is 128x128 (see av1_select_sb_size()).
  constexpr int kWidth = 256;
  constexpr int kHeight = 512;

  aom_image_t img;
  EXPECT_EQ(&img, aom_img_wrap(&img, fmt, kWidth, kHeight, 1,
                               const_cast<unsigned char *>(kBuffer)));

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, 0));
  cfg.g_threads = 2;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, flag));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}